

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O1

int __thiscall GrcErrorList::ErrorsAtLine(GrcErrorList *this,int nLine,int *piperrFirst)

{
  pointer ppGVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  ppGVar1 = (this->m_vperr).super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar4 = -1;
  uVar6 = (uint)((ulong)((long)(this->m_vperr).
                               super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1) >> 3);
  bVar8 = 0 < (int)uVar6;
  if ((int)uVar6 < 1) {
    iVar4 = -1;
    uVar3 = 0;
  }
  else {
    if (((*ppGVar1)->m_lnf).m_nLinePre < nLine) {
      uVar5 = 0;
      do {
        if ((ulong)(uVar6 & 0x7fffffff) - 1 == uVar5) {
          uVar3 = 0;
          goto LAB_00161fbe;
        }
        lVar2 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while ((ppGVar1[lVar2]->m_lnf).m_nLinePre < nLine);
      bVar8 = uVar5 < (uVar6 & 0x7fffffff);
      uVar7 = uVar6 - (int)uVar5;
    }
    else {
      uVar5 = 0;
      uVar7 = uVar6;
    }
    uVar3 = 0;
    if ((bVar8) && ((ppGVar1[uVar5 & 0xffffffff]->m_lnf).m_nLinePre <= nLine)) {
      iVar4 = (int)uVar5;
      uVar5 = 1;
      if (iVar4 + 1 < (int)uVar6) {
        uVar5 = 1;
        do {
          if ((ppGVar1[(uint)(iVar4 + (int)uVar5)]->m_lnf).m_nLinePre != nLine) goto LAB_00161fba;
          uVar5 = uVar5 + 1;
          uVar3 = uVar7;
        } while (uVar7 != uVar5);
      }
      else {
LAB_00161fba:
        uVar3 = (uint)uVar5;
      }
    }
  }
LAB_00161fbe:
  *piperrFirst = iVar4;
  return uVar3;
}

Assistant:

int GrcErrorList::ErrorsAtLine(int nLine, int * piperrFirst)
{
	int iperrFirst = 0;
	while (iperrFirst < signed(m_vperr.size()) && m_vperr[iperrFirst]->PreProcessedLine() < nLine)
		iperrFirst++;

	if (iperrFirst >= signed(m_vperr.size()) || nLine < m_vperr[iperrFirst]->PreProcessedLine())
	{
		*piperrFirst = -1;
		return 0;
	}

	int cperr = 1;
	while (iperrFirst + cperr < signed(m_vperr.size()) &&
		m_vperr[iperrFirst + cperr]->PreProcessedLine() == nLine)
	{
		cperr++;
	}

	*piperrFirst = iperrFirst;
	return cperr;
}